

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O1

void dijkstra_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *adj_list,int from,vector<int,_std::allocator<int>_> *dists)

{
  pointer piVar1;
  pointer pvVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int v;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<bool,_std::allocator<bool>_> used;
  Timer timer;
  vector<bool,_std::allocator<bool>_> local_60;
  Timer local_38;
  
  uVar8 = (int)((long)(adj_list->
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(adj_list->
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,999999);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (dists,(long)(int)uVar8,(value_type_conflict *)&local_60);
  (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [from] = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&local_60,(long)(int)uVar8,false);
  Timer::Timer(&local_38);
  if (0 < (int)uVar8) {
    piVar1 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pvVar2 = (adj_list->
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      piVar3 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = -1;
      uVar10 = 0;
      do {
        if (((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) &&
           ((iVar9 == -1 || (piVar3[uVar10] < piVar3[iVar9])))) {
          iVar9 = (int)uVar10;
        }
        uVar10 = uVar10 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar10);
      uVar10 = (ulong)iVar9;
      if (piVar1[uVar10] == 999999) break;
      uVar7 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar7 = uVar10;
      }
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)iVar9 & 0x3f);
      lVar4 = *(long *)&pvVar2[uVar10].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar11 = (long)*(pointer *)
                      ((long)&pvVar2[uVar10].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - lVar4;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 3;
        lVar12 = 0;
        do {
          iVar9 = *(int *)(lVar4 + lVar12 * 8);
          iVar5 = piVar1[uVar10] + *(int *)(lVar4 + 4 + lVar12 * 8);
          if (iVar5 < piVar1[iVar9]) {
            piVar1[iVar9] = iVar5;
          }
          lVar12 = lVar12 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar8);
  }
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void dijkstra_sync(const vector<vector<pair<int, int>>>& adj_list, int from, vector<int>& dists){
    int vs = adj_list.size();
    dists.assign(vs, MAX_INT);
    dists[from] = 0;
    vector<bool> used;
    used.assign(vs, false);
    int curr_v;

    Timer timer = Timer();

    for (int i=0; i<vs; i++){
        // search unused
        curr_v = -1;

        for (int v=0; v<vs; v++) {
            if (!used[v] && (curr_v == -1 || dists[v] < dists[curr_v])) {
                curr_v = v;
            }
        }
        // have visited all reachable vertexes
        if (dists[curr_v] == MAX_INT){
            return;
        }

        used[curr_v] = true;

        int to, weight;
        // Search least path
        for (int j=0; j<adj_list[curr_v].size(); j++){
            to = adj_list[curr_v][j].first;
            weight = adj_list[curr_v][j].second;
            if (dists[curr_v] + weight < dists[to]){
                // Relax
                dists[to] = dists[curr_v] + weight;
            }
        }
    }
}